

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertGreaterOrLessOrEqualNumber
               (UNITY_INT threshold,UNITY_INT actual,UNITY_COMPARISON_T compare,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style)

{
  bool bVar1;
  char *string;
  bool bVar2;
  
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) goto LAB_00101e60;
  if ((threshold == actual & (byte)compare) != 0) {
    return;
  }
  bVar2 = threshold == actual;
  if ((style & 0x10) == 0) {
    bVar1 = (compare & UNITY_SMALLER_THAN) != UNITY_NOT_EQUAL || bVar2;
    if ((ulong)actual <= (ulong)threshold) {
      bVar1 = bVar2;
    }
    if (((ulong)actual < (ulong)threshold & (byte)((compare & UNITY_GREATER_THAN) >> 1)) == 0)
    goto LAB_00101dd4;
LAB_00101d94:
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintNumberByStyle(actual,style);
LAB_00101e05:
    UnityPrint(" to be greater than ");
  }
  else {
    bVar1 = (compare & UNITY_SMALLER_THAN) != UNITY_NOT_EQUAL || bVar2;
    if (actual <= threshold) {
      bVar1 = bVar2;
    }
    if (actual < threshold && (compare & UNITY_GREATER_THAN) != UNITY_NOT_EQUAL) goto LAB_00101d94;
LAB_00101dd4:
    if (!bVar1) {
      return;
    }
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintNumberByStyle(actual,style);
    if ((compare & UNITY_GREATER_THAN) != UNITY_NOT_EQUAL) goto LAB_00101e05;
  }
  if ((compare & UNITY_SMALLER_THAN) != UNITY_NOT_EQUAL) {
    UnityPrint(" to be less than ");
  }
  if ((compare & UNITY_EQUAL_TO) == UNITY_NOT_EQUAL) {
    if (compare == UNITY_NOT_EQUAL) {
      string = " to be not equal to ";
      goto LAB_00101e3e;
    }
  }
  else {
    string = "or equal to ";
LAB_00101e3e:
    UnityPrint(string);
  }
  UnityPrintNumberByStyle(threshold,style);
  UnityAddMsgIfSpecified(msg);
  Unity.CurrentTestFailed = 1;
LAB_00101e60:
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertGreaterOrLessOrEqualNumber(const UNITY_INT threshold,
                                           const UNITY_INT actual,
                                           const UNITY_COMPARISON_T compare,
                                           const char *msg,
                                           const UNITY_LINE_TYPE lineNumber,
                                           const UNITY_DISPLAY_STYLE_T style)
{
    int failed = 0;
    RETURN_IF_FAIL_OR_IGNORE;

    if ((threshold == actual) && (compare & UNITY_EQUAL_TO)) { return; }
    if ((threshold == actual))                               { failed = 1; }

    if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
    {
        if ((actual > threshold) && (compare & UNITY_SMALLER_THAN)) { failed = 1; }
        if ((actual < threshold) && (compare & UNITY_GREATER_THAN)) { failed = 1; }
    }
    else /* UINT or HEX */
    {
        if (((UNITY_UINT)actual > (UNITY_UINT)threshold) && (compare & UNITY_SMALLER_THAN)) { failed = 1; }
        if (((UNITY_UINT)actual < (UNITY_UINT)threshold) && (compare & UNITY_GREATER_THAN)) { failed = 1; }
    }

    if (failed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        UnityPrintNumberByStyle(actual, style);
        if (compare & UNITY_GREATER_THAN) { UnityPrint(UnityStrGt);       }
        if (compare & UNITY_SMALLER_THAN) { UnityPrint(UnityStrLt);       }
        if (compare & UNITY_EQUAL_TO)     { UnityPrint(UnityStrOrEqual);  }
        if (compare == UNITY_NOT_EQUAL)   { UnityPrint(UnityStrNotEqual); }
        UnityPrintNumberByStyle(threshold, style);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}